

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpthreaddelegate_p.cpp
# Opt level: O3

void QNonContiguousByteDeviceThreadForwardImpl::qt_static_metacall
               (QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == wantData && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == processedData && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == resetData && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      local_30 = *_a[1];
      iVar3 = 0;
      break;
    case 1:
      local_30 = *_a[1];
      local_38 = *_a[2];
      iVar3 = 1;
      local_18 = (undefined1 *)&local_38;
      break;
    case 2:
      local_30 = *_a[1];
      iVar3 = 2;
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        haveDataSlot((QNonContiguousByteDeviceThreadForwardImpl *)_o,*_a[1],(QByteArray *)_a[2],
                     *_a[3],*_a[4]);
        return;
      }
      goto LAB_0021280f;
    default:
      goto switchD_002126c2_default;
    }
    local_20 = &local_30;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28);
  }
switchD_002126c2_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0021280f:
  __stack_chk_fail();
}

Assistant:

void QNonContiguousByteDeviceThreadForwardImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNonContiguousByteDeviceThreadForwardImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->wantData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 1: _t->processedData((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 2: _t->resetData((*reinterpret_cast< std::add_pointer_t<bool*>>(_a[1]))); break;
        case 3: _t->haveDataSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[4]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(qint64 )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::wantData, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(qint64 , qint64 )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::processedData, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNonContiguousByteDeviceThreadForwardImpl::*)(bool * )>(_a, &QNonContiguousByteDeviceThreadForwardImpl::resetData, 2))
            return;
    }
}